

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       *this,uint i)

{
  char **ppcVar1;
  undefined4 in_ESI;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *ret
  ;
  char **this_00;
  undefined4 in_stack_ffffffffffffffb8;
  
  ppcVar1 = &in_RDI->stackEnd_;
  this_00 = ppcVar1;
  if ((long)in_RDI[1].stack_ - (long)in_RDI[1].ownAllocator_ < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  }
  in_RDI[1].ownAllocator_ = in_RDI[1].ownAllocator_ + 0x10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this_00,(uint)((ulong)ppcVar1 >> 0x20));
  return true;
}

Assistant:

bool Uint(unsigned i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }